

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchWebsocket.cpp
# Opt level: O2

void sendPacket(PTR *session,char *data,size_t len)

{
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> frame
  ;
  BasePacketWriter bw;
  _Any_data local_428;
  undefined8 local_418;
  undefined8 uStack_410;
  char buff [1024];
  
  bw._vptr_BasePacketWriter = (_func_int **)&PTR__BasePacketWriter_0010cce0;
  bw.mBigEndian = true;
  bw.mIsAutoMalloc = true;
  bw.mMaxLen = 0x400;
  bw.mPos = 0;
  bw.mBuffer = buff;
  bw.mMallocBuffer = (char *)0x0;
  BasePacketWriter::writeINT8(&bw,'{');
  BasePacketWriter::writeBuffer(&bw,"\"data\":\"",8);
  BasePacketWriter::writeBuffer(&bw,"hello, world!",0xd);
  BasePacketWriter::writeINT8(&bw,'\"');
  BasePacketWriter::writeINT8(&bw,'}');
  std::make_shared<std::__cxx11::string>();
  brynet::net::WebSocketFormat::wsFrameBuild
            (bw.mBuffer,bw.mPos,
             frame.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,TEXT_FRAME,true,true);
  local_418 = 0;
  uStack_410 = 0;
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  brynet::net::HttpSession::send
            ((shared_ptr *)
             (session->super___shared_ptr<brynet::net::HttpSession,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,(function *)&frame);
  std::_Function_base::~_Function_base((_Function_base *)&local_428);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&frame.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  BasePacketWriter::~BasePacketWriter(&bw);
  return;
}

Assistant:

static void sendPacket(HttpSession::PTR session, const char* data, size_t len)
{
    char buff[1024];
    BasePacketWriter bw(buff, sizeof(buff), true, true);
    bw.writeINT8('{');
    bw.writeBuffer("\"data\":\"", 8);
    bw.writeBuffer(data, len);
    bw.writeINT8('"');
    bw.writeINT8('}');

    auto frame = std::make_shared<std::string>();
    WebSocketFormat::wsFrameBuild(bw.getData(), bw.getPos(), *frame, WebSocketFormat::WebSocketFrameType::TEXT_FRAME, true, true);
    session->send(frame);
}